

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
slang::CommandLine::addInternal
          (CommandLine *this,string_view name,OptionStorage *storage,string_view desc,
          string_view valueName,bitmask<slang::CommandLineFlags> flags)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  size_type __n;
  invalid_argument *piVar2;
  char *extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>,_bool>
  pVar5;
  format_args args;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  shared_ptr<slang::CommandLine::Option> option;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  CommandLine *local_80;
  string_view desc_local;
  key_type local_68;
  char *local_48;
  size_t local_40;
  
  aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)desc._M_str;
  desc_local._M_len = desc._M_len;
  local_90 = name;
  desc_local._M_str = (char *)aVar3;
  if (name._M_len == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Name cannot be empty");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::make_shared<slang::CommandLine::Option>();
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             &(option.super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->desc,&desc_local);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             &(option.super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->valueName,&valueName);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             &(option.super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->allArgNames,&local_90);
  std::__detail::__variant::
  _Move_assign_base<false,_std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::operator=((_Move_assign_base<false,_std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
               *)option.super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,
              (_Move_assign_base<false,_std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
               *)storage);
  ((option.super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->flags
  ).m_bits = flags.m_bits;
  local_80 = this;
  while( true ) {
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_90,',',0);
    local_b8 = local_90;
    bVar1 = local_b8;
    if (__n == 0xffffffffffffffff) {
      local_b8._M_len = local_90._M_len;
      bVar4._M_str = extraout_RDX;
      bVar4._M_len = local_b8._M_len;
      local_b8 = bVar1;
    }
    else {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_90,0,__n);
      local_b8 = bVar4;
    }
    if (bVar4._M_len < 2) break;
    if (*local_b8._M_str != '+') {
      if (*local_b8._M_str != '-') break;
      local_b8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_b8,1,0xffffffffffffffff);
      if (*local_b8._M_str == '-') {
        local_b8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_b8,1,0xffffffffffffffff);
        if (local_b8._M_len == 0) {
          piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar2,"Names must begin with \'-\' or \'--\'");
          goto LAB_0027c368;
        }
      }
      else if (1 < local_b8._M_len) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar2,"Long name requires \'--\' prefix");
        goto LAB_0027c368;
      }
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_68,&local_b8,(allocator<char> *)&local_48);
    pVar5 = std::
            map<std::__cxx11::string,std::shared_ptr<slang::CommandLine::Option>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<slang::CommandLine::Option>>>>
            ::try_emplace<std::shared_ptr<slang::CommandLine::Option>&>
                      ((map<std::__cxx11::string,std::shared_ptr<slang::CommandLine::Option>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<slang::CommandLine::Option>>>>
                        *)&this->optionMap,&local_68,&option);
    std::__cxx11::string::~string((string *)&local_68);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_48 = local_b8._M_str;
      local_40 = local_b8._M_len;
      args.field_1.args_ = aVar3.args_;
      args.desc_ = (unsigned_long_long)&local_48;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x26;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_68,(v11 *)"Argument with name \'{}\' already exists",fmt,args);
      std::invalid_argument::invalid_argument(piVar2,(string *)&local_68);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (__n == 0xffffffffffffffff) {
      std::
      vector<std::shared_ptr<slang::CommandLine::Option>,std::allocator<std::shared_ptr<slang::CommandLine::Option>>>
      ::emplace_back<std::shared_ptr<slang::CommandLine::Option>&>
                ((vector<std::shared_ptr<slang::CommandLine::Option>,std::allocator<std::shared_ptr<slang::CommandLine::Option>>>
                  *)&local_80->orderedOptions,&option);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&option.super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    local_90 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_90,__n + 1,0xffffffffffffffff);
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Names must begin with \'-\', \'+\', or \'--\'");
LAB_0027c368:
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void CommandLine::addInternal(std::string_view name, OptionStorage storage, std::string_view desc,
                              std::string_view valueName, bitmask<CommandLineFlags> flags) {
    if (name.empty())
        SLANG_THROW(std::invalid_argument("Name cannot be empty"));

    auto option = std::make_shared<Option>();
    option->desc = desc;
    option->valueName = valueName;
    option->allArgNames = name;
    option->storage = std::move(storage); // NOLINT
    option->flags = flags;

    while (true) {
        size_t index = name.find_first_of(',');
        std::string_view curr = name;
        if (index != std::string_view::npos)
            curr = name.substr(0, index);

        if (curr.length() <= 1 || (curr[0] != '-' && curr[0] != '+'))
            SLANG_THROW(std::invalid_argument("Names must begin with '-', '+', or '--'"));

        if (curr[0] != '+') {
            curr = curr.substr(1);
            if (curr[0] == '-') {
                curr = curr.substr(1);
                if (curr.empty())
                    SLANG_THROW(std::invalid_argument("Names must begin with '-' or '--'"));
            }
            else if (curr.length() > 1) {
                SLANG_THROW(std::invalid_argument("Long name requires '--' prefix"));
            }
        }

        if (!optionMap.try_emplace(std::string(curr), option).second) {
            SLANG_THROW(
                std::invalid_argument(fmt::format("Argument with name '{}' already exists", curr)));
        }

        if (index == std::string_view::npos)
            break;
        name = name.substr(index + 1);
    }

    orderedOptions.emplace_back(option);
}